

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlGetDtdQAttrDesc(void)

{
  int iVar1;
  int iVar2;
  xmlDtdPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlAttributePtr val_03;
  int local_54;
  int n_prefix;
  xmlChar *prefix;
  int n_name;
  xmlChar *name;
  int n_elem;
  xmlChar *elem;
  int n_dtd;
  xmlDtdPtr dtd;
  xmlAttributePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (elem._4_4_ = 0; (int)elem._4_4_ < 3; elem._4_4_ = elem._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
      for (prefix._4_4_ = 0; (int)prefix._4_4_ < 5; prefix._4_4_ = prefix._4_4_ + 1) {
        for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlDtdPtr(elem._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(name._4_4_,1);
          val_01 = gen_const_xmlChar_ptr(prefix._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_54,3);
          val_03 = (xmlAttributePtr)xmlGetDtdQAttrDesc(val,val_00,val_01,val_02);
          desret_xmlAttributePtr(val_03);
          call_tests = call_tests + 1;
          des_xmlDtdPtr(elem._4_4_,val,0);
          des_const_xmlChar_ptr(name._4_4_,val_00,1);
          des_const_xmlChar_ptr(prefix._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlGetDtdQAttrDesc",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)elem._4_4_);
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)prefix._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlGetDtdQAttrDesc(void) {
    int test_ret = 0;

    int mem_base;
    xmlAttributePtr ret_val;
    xmlDtdPtr dtd; /* a pointer to the DtD to search */
    int n_dtd;
    const xmlChar * elem; /* the element name */
    int n_elem;
    const xmlChar * name; /* the attribute name */
    int n_name;
    const xmlChar * prefix; /* the attribute namespace prefix */
    int n_prefix;

    for (n_dtd = 0;n_dtd < gen_nb_xmlDtdPtr;n_dtd++) {
    for (n_elem = 0;n_elem < gen_nb_const_xmlChar_ptr;n_elem++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
        mem_base = xmlMemBlocks();
        dtd = gen_xmlDtdPtr(n_dtd, 0);
        elem = gen_const_xmlChar_ptr(n_elem, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        prefix = gen_const_xmlChar_ptr(n_prefix, 3);

        ret_val = xmlGetDtdQAttrDesc(dtd, elem, name, prefix);
        desret_xmlAttributePtr(ret_val);
        call_tests++;
        des_xmlDtdPtr(n_dtd, dtd, 0);
        des_const_xmlChar_ptr(n_elem, elem, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        des_const_xmlChar_ptr(n_prefix, prefix, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlGetDtdQAttrDesc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_dtd);
            printf(" %d", n_elem);
            printf(" %d", n_name);
            printf(" %d", n_prefix);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}